

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O2

void __thiscall Perseus::PlanLeadIn(Perseus *this)

{
  _func_int *p_Var1;
  ostream *poVar2;
  string local_40;
  
  p_Var1 = this->_vptr_Perseus[-3];
  std::__cxx11::string::string((string *)&local_40,(string *)&this->_m_identification);
  TimedAlgorithm::StartTimer
            ((TimedAlgorithm *)((long)&this->_vptr_Perseus + (long)p_Var1),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (this->_m_beliefsInitialized == false) {
    srand(0x2a);
    if (-1 < this->_m_verbose) {
      std::__cxx11::string::string((string *)&local_40,(string *)&this->_m_identification);
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_40);
      poVar2 = std::operator<<(poVar2,": sampling ");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1000);
      std::operator<<(poVar2," beliefs");
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::ostream::flush();
    (*this->_vptr_Perseus[1])(this,1000,1);
    if (-1 < this->_m_verbose) {
      poVar2 = std::operator<<((ostream *)&std::cout,".");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  PrintMaxRewardInBeliefSet(this);
  return;
}

Assistant:

void Perseus::PlanLeadIn()
{
    StartTimer(GetIdentification());

    if(!_m_beliefsInitialized)
    {
        int nrB=1000;
        // set the random seed and sample beliefs
        srand(42);
        if(GetVerbose() >= 0)
            cout << GetIdentification() << ": sampling " << nrB
                 << " beliefs"; cout.flush();
        InitializeBeliefs(nrB,true);
        if(GetVerbose() >= 0)
            cout << "." << endl;
    }

    // just a manual check to figure out if the belief set has potential
    PrintMaxRewardInBeliefSet();
}